

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::EnforceCommentStyle::fodder(EnforceCommentStyle *this,Fodder *fodder)

{
  bool bVar1;
  reference pFVar2;
  size_type sVar3;
  long in_RDI;
  FodderElement *f;
  iterator __end2;
  iterator __begin2;
  Fodder *__range2;
  bool in_stack_00000067;
  string *in_stack_00000068;
  EnforceCommentStyle *in_stack_00000070;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  Kind in_stack_ffffffffffffffc4;
  __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (FodderElement *)
       std::
       vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
       begin(in_stack_ffffffffffffffb8);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                             *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            (__normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    pFVar2 = __gnu_cxx::
             __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
             ::operator*(local_20);
    in_stack_ffffffffffffffc4 = pFVar2->kind;
    if (((in_stack_ffffffffffffffc4 == LINE_END) ||
        ((in_stack_ffffffffffffffc4 != INTERSTITIAL && (in_stack_ffffffffffffffc4 == PARAGRAPH))))
       && (sVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&pFVar2->comment), sVar3 == 1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&pFVar2->comment,0);
      fixComment(in_stack_00000070,in_stack_00000068,in_stack_00000067);
    }
    *(undefined1 *)(in_RDI + 0x24) = 0;
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::FodderElement_*,_std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void fodder(Fodder &fodder)
    {
        for (auto &f : fodder) {
            switch (f.kind) {
                case FodderElement::LINE_END:
                case FodderElement::PARAGRAPH:
                    if (f.comment.size() == 1) {
                        fixComment(f.comment[0], firstFodder);
                    }
                    break;

                case FodderElement::INTERSTITIAL: break;
            }
            firstFodder = false;
        }
    }